

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_edf1.c
# Opt level: O0

void lb07_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *in_RSI;
  xc_func_type *in_RDI;
  char *name;
  xc_func_type *p_00;
  double omega;
  double w;
  double *in_stack_ffffffffffffffd8;
  
  name = (char *)get_ext_param(in_RDI,(double *)in_RSI,0);
  p_00 = (xc_func_type *)get_ext_param(in_RDI,(double *)in_RSI,1);
  *in_RDI->mix_coef = (double)name;
  xc_func_set_ext_params_name(in_RSI,name,(double)p_00);
  set_ext_params_lc(p_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void
lb07_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double w, omega;

  assert(p != NULL);
  w     = get_ext_param(p, ext_params, 0);
  omega = get_ext_param(p, ext_params, 1);

  /* Short-range LDA */
  p->mix_coef[0] = w;
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  /* 100% long-range exchange */
  set_ext_params_lc(p, ext_params);
}